

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_embedded_expr(CTcEmbedBuilder *b,CTcEmbedTokenList *tl)

{
  int iVar1;
  CTcStrTemplate *tl_00;
  CTcEmbedTokenList *this;
  CTcPrsNode *pCVar2;
  CTPNArglist *arglist_00;
  CTcEmbedBuilder *in_RSI;
  long *in_RDI;
  CTcPrsNode *sub;
  CTPNArglist *arglist;
  CTPNSymResolved *func;
  CTcStrTemplate *st;
  CTcSymbol *in_stack_ffffffffffffff88;
  CTPNArg *in_stack_ffffffffffffff90;
  CTcPrsNode *in_stack_ffffffffffffff98;
  CTPNArglist *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  CTcEmbedTokenList *in_stack_ffffffffffffffb0;
  CTcStrTemplate *in_stack_ffffffffffffffb8;
  CTcStrTemplate *in_stack_ffffffffffffffc0;
  CTcEmbedTokenList *in_stack_ffffffffffffffc8;
  
  tl_00 = CTcParser::get_str_template_head(G_prs);
  while( true ) {
    if (tl_00 == (CTcStrTemplate *)0x0) {
      CTcEmbedTokenList::unget
                (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                 (int)in_stack_ffffffffffffffa8);
      pCVar2 = (CTcPrsNode *)(**(code **)(*in_RDI + 0x18))();
      return pCVar2;
    }
    iVar1 = CTcEmbedTokenList::match(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (iVar1 != 0) break;
    tl_00 = tl_00->nxt;
  }
  this = (CTcEmbedTokenList *)CTcPrsAllocObj::operator_new(0x256620);
  CTPNSymResolved::CTPNSymResolved
            ((CTPNSymResolved *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (tl_00->star == 0) {
    in_stack_ffffffffffffff98 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x25677b);
    CTPNArglist::CTPNArglist
              (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
               in_stack_ffffffffffffff90);
  }
  else {
    if (tl_00->cnt < 2) {
      CTcEmbedTokenList::unget
                (this,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8
                );
      pCVar2 = (CTcPrsNode *)(**(code **)(*in_RDI + 0x18))();
    }
    else {
      CTcEmbedTokenList::reduce
                ((CTcEmbedTokenList *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      pCVar2 = parse_embedded_expr(in_RSI,(CTcEmbedTokenList *)tl_00);
    }
    if (pCVar2 == (CTcPrsNode *)0x0) {
      return (CTcPrsNode *)0x0;
    }
    in_stack_ffffffffffffffa0 = (CTPNArglist *)CTcPrsAllocObj::operator_new(0x2566e4);
    CTcPrsAllocObj::operator_new(0x2566f3);
    CTPNArg::CTPNArg(in_stack_ffffffffffffff90,(CTcPrsNode *)in_stack_ffffffffffffff88);
    CTPNArglist::CTPNArglist
              (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
               in_stack_ffffffffffffff90);
  }
  arglist_00 = (CTPNArglist *)CTcPrsAllocObj::operator_new(0x2567c9);
  CTPNCall::CTPNCall((CTPNCall *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,arglist_00);
  return (CTcPrsNode *)arglist_00;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_embedded_expr(
    CTcEmbedBuilder *b, CTcEmbedTokenList *tl)
{
    /* search for a template for the expression */
    for (CTcStrTemplate *st = G_prs->get_str_template_head() ; st != 0 ;
         st = st->nxt)
    {
        /* check for a match */
        if (tl->match(st))
        {
            /*
             *   This template matches.  Generate the code as a call to the
             *   template's processor function.
             */
            CTPNSymResolved *func = new CTPNSymResolved(st->func);

            /* 
             *   If the template has a '*', the tokens matching the star are
             *   a sub-expression that we evaluate as the argument to the
             *   function.  Otherwise we call it with no arguments. 
             */
            CTPNArglist *arglist;
            if (st->star)
            {
                /* 
                 *   If the template has any fixed tokens, reparse the
                 *   remaining tokens to see if they refer to a new template.
                 *   If the template was just '*', skip this, since we'd just
                 *   find the same match again.  
                 */
                CTcPrsNode *sub;
                if (st->cnt > 1)
                {
                    /* remove the tokens that matched the fixed part */
                    tl->reduce(st);

                    /* reparse as a new embedded expression */
                    sub = parse_embedded_expr(b, tl);
                }
                else
                {
                    /* the template is just '*', so parse a raw expression */
                    tl->unget();
                    sub = b->parse_expr();
                }

                /* if we failed to parse a sub-expression, return failure */
                if (sub == 0)
                    return 0;
                
                /* create the argument list */
                arglist = new CTPNArglist(1, new CTPNArg(sub));
            }
            else
            {
                /* there's no argument list */
                arglist = new CTPNArglist(0, 0);
            }

            /* create and return the call to the template function */
            return new CTPNCall(func, arglist);
        }
    }

    /* 
     *   There's no template, so process it as an ordinary expression.  Put
     *   the captured token list back into the token stream, and parse an
     *   expression node.  
     */
    tl->unget();
    return b->parse_expr();
}